

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Estimate<double> * __thiscall
Catch::Benchmark::Detail::
bootstrap<double(*&)(__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>)>
          (Estimate<double> *__return_storage_ptr__,Detail *this,double confidence_level,
          iterator first,iterator last,sample *resample,
          _func_double___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>
          **estimator)

{
  code *pcVar1;
  bool bVar2;
  reference pdVar3;
  double dVar4;
  const_iterator __first;
  const_iterator __last;
  difference_type dVar5;
  size_type *psVar6;
  const_reference pvVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  long local_1a0;
  long local_198;
  size_type local_190;
  size_t hi;
  long local_180;
  size_type local_178;
  size_t lo;
  double a2;
  double a1;
  double b2;
  double b1;
  anon_class_16_2_f681591a a;
  anon_class_8_1_54a3980e cumn;
  double z1;
  double bias;
  double prob_n;
  long n;
  double accel;
  double cube;
  double square;
  double difference;
  double x;
  iterator __end3;
  iterator __begin3;
  sample *__range3;
  double sum_cubes;
  double sum_squares;
  const_iterator local_98;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_90;
  const_iterator local_88;
  double local_80;
  double jack_mean;
  double *local_70;
  undefined1 local_68 [8];
  sample jack;
  undefined8 local_48;
  anon_class_8_1_a87844b0_for__M_pred local_40;
  double point;
  difference_type n_samples;
  _func_double___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>
  **estimator_local;
  sample *resample_local;
  double confidence_level_local;
  iterator last_local;
  iterator first_local;
  
  n_samples = (difference_type)resample;
  estimator_local =
       (_func_double___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>
        **)last._M_current;
  resample_local = (sample *)confidence_level;
  confidence_level_local = (double)first._M_current;
  last_local._M_current = (double *)this;
  point = (double)__gnu_cxx::operator-
                            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                              *)&confidence_level_local,&last_local);
  pcVar1 = *(code **)n_samples;
  __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
  __normal_iterator<double*>
            ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
             &local_48,&last_local);
  __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
  __normal_iterator<double*>
            ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
             &jack.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
             &confidence_level_local);
  local_40.point =
       (double)(*pcVar1)(local_48,jack.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage);
  if (point == 4.94065645841247e-324) {
    __return_storage_ptr__->point = local_40.point;
    __return_storage_ptr__->lower_bound = local_40.point;
    __return_storage_ptr__->upper_bound = local_40.point;
    __return_storage_ptr__->confidence_interval = (double)resample_local;
  }
  else {
    local_70 = last_local._M_current;
    jack_mean = confidence_level_local;
    jackknife<double(*&)(__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>)>
              ((sample *)local_68,(Detail *)n_samples,
               (_func_double___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>
                **)last_local._M_current,(iterator)confidence_level_local,(iterator)resample);
    local_90._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)local_68);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
               &local_88,&local_90);
    sum_squares = (double)std::vector<double,_std::allocator<double>_>::end
                                    ((vector<double,_std::allocator<double>_> *)local_68);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
               &local_98,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               &sum_squares);
    local_80 = mean(local_88,local_98);
    sum_cubes = 0.0;
    __range3 = (sample *)0x0;
    __end3 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)local_68);
    x = (double)std::vector<double,_std::allocator<double>_>::end
                          ((vector<double,_std::allocator<double>_> *)local_68);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                  *)&x);
      if (!bVar2) break;
      pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&__end3);
      dVar4 = local_80 - *pdVar3;
      sum_cubes = dVar4 * dVar4 + sum_cubes;
      __range3 = (sample *)(dVar4 * dVar4 * dVar4 + (double)__range3);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&__end3);
    }
    dVar8 = pow(sum_cubes,1.5);
    dVar4 = (double)std::vector<double,_std::allocator<double>_>::size
                              ((vector<double,_std::allocator<double>_> *)estimator_local);
    __first = std::vector<double,_std::allocator<double>_>::begin
                        ((vector<double,_std::allocator<double>_> *)estimator_local);
    __last = std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)estimator_local);
    dVar5 = std::
            count_if<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,Catch::Benchmark::Detail::bootstrap<double(*&)(__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>)>(double,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::vector<double,std::allocator<double>>const&,double(*&)(__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>))::_lambda(double)_1_>
                      ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        )__first._M_current,
                       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        )__last._M_current,local_40);
    bVar2 = directCompare((double)dVar5 / (double)(long)dVar4,0.0);
    if (bVar2) {
      __return_storage_ptr__->point = local_40.point;
      __return_storage_ptr__->lower_bound = local_40.point;
      __return_storage_ptr__->upper_bound = local_40.point;
      __return_storage_ptr__->confidence_interval = (double)resample_local;
    }
    else {
      dVar9 = normal_quantile((double)dVar5 / (double)(long)dVar4);
      dVar10 = normal_quantile((1.0 - (double)resample_local) * 0.5);
      b2 = dVar9 + dVar10;
      a1 = dVar9 - dVar10;
      b1 = dVar9;
      a.bias = (double)__range3 / (dVar8 * 6.0);
      a.accel = dVar4;
      a2 = bootstrap<double_(*&)(__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)>
           ::anon_class_16_2_f681591a::operator()((anon_class_16_2_f681591a *)&b1,b2);
      lo = (size_t)bootstrap<double_(*&)(__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)>
                   ::anon_class_16_2_f681591a::operator()((anon_class_16_2_f681591a *)&b1,a1);
      local_180 = bootstrap<double_(*&)(__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)>
                  ::anon_class_8_1_54a3980e::operator()((anon_class_8_1_54a3980e *)&a.accel,a2);
      hi = 0;
      psVar6 = (size_type *)std::max<long>(&local_180,(long *)&hi);
      local_178 = *psVar6;
      local_198 = bootstrap<double_(*&)(__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)>
                  ::anon_class_8_1_54a3980e::operator()
                            ((anon_class_8_1_54a3980e *)&a.accel,(double)lo);
      local_1a0 = (long)dVar4 - 1;
      psVar6 = (size_type *)std::min<long>(&local_198,&local_1a0);
      local_190 = *psVar6;
      __return_storage_ptr__->point = local_40.point;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)estimator_local,local_178);
      __return_storage_ptr__->lower_bound = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)estimator_local,local_190);
      __return_storage_ptr__->upper_bound = *pvVar7;
      __return_storage_ptr__->confidence_interval = (double)resample_local;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

Estimate<double> bootstrap( double confidence_level,
                                        std::vector<double>::iterator first,
                                        std::vector<double>::iterator last,
                                        sample const& resample,
                                        Estimator&& estimator ) {
                auto n_samples = last - first;

                double point = estimator(first, last);
                // Degenerate case with a single sample
                if (n_samples == 1) return { point, point, point, confidence_level };

                sample jack = jackknife(estimator, first, last);
                double jack_mean = mean(jack.begin(), jack.end());
                double sum_squares = 0, sum_cubes = 0;
                for (double x : jack) {
                    auto difference = jack_mean - x;
                    auto square = difference * difference;
                    auto cube = square * difference;
                    sum_squares += square; sum_cubes += cube;
                }

                double accel = sum_cubes / (6 * std::pow(sum_squares, 1.5));
                long n = static_cast<long>(resample.size());
                double prob_n = std::count_if(resample.begin(), resample.end(), [point](double x) { return x < point; }) / static_cast<double>(n);
                // degenerate case with uniform samples
                if ( directCompare( prob_n, 0. ) ) {
                    return { point, point, point, confidence_level };
                }

                double bias = normal_quantile(prob_n);
                double z1 = normal_quantile((1. - confidence_level) / 2.);

                auto cumn = [n]( double x ) -> long {
                    return std::lround( normal_cdf( x ) * static_cast<double>(n) );
                };
                auto a = [bias, accel](double b) { return bias + b / (1. - accel * b); };
                double b1 = bias + z1;
                double b2 = bias - z1;
                double a1 = a(b1);
                double a2 = a(b2);
                auto lo = static_cast<size_t>((std::max)(cumn(a1), 0l));
                auto hi = static_cast<size_t>((std::min)(cumn(a2), n - 1));

                return { point, resample[lo], resample[hi], confidence_level };
            }